

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O0

void __thiscall
duckdb::CMChildInfo::CMChildInfo
          (CMChildInfo *this,LogicalOperator *op,column_binding_set_t *referenced_bindings)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference rhs;
  undefined8 in_RDX;
  long *in_RSI;
  vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *in_RDI;
  reference rVar4;
  idx_t binding_idx;
  value_type *binding;
  const_iterator __end1;
  const_iterator __begin1;
  column_binding_set_t *__range1;
  allocator_type *in_stack_ffffffffffffff38;
  bool *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  vector<bool,_true> *in_stack_ffffffffffffff50;
  reference this_00;
  reference local_68;
  ulong local_58;
  reference local_50;
  _Node_iterator_base<duckdb::ColumnBinding,_true> local_48;
  _Node_iterator_base<duckdb::ColumnBinding,_true> local_40;
  undefined8 local_38;
  undefined1 local_19;
  undefined8 local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0x10))();
  in_RDI[1].super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(local_10 + 8);
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::size(in_RDI);
  local_19 = 1;
  ::std::allocator<bool>::allocator((allocator<bool> *)0xcfa66a);
  vector<bool,_true>::vector
            (in_stack_ffffffffffffff50,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
             ,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  ::std::allocator<bool>::~allocator((allocator<bool> *)0xcfa695);
  vector<duckdb::ColumnBinding,_true>::vector((vector<duckdb::ColumnBinding,_true> *)0xcfa6a8);
  local_38 = local_18;
  local_40._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>
       ::begin((unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>
                *)in_stack_ffffffffffffff38);
  local_48._M_cur =
       (__node_type *)
       ::std::
       unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>
       ::end((unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>
              *)in_stack_ffffffffffffff38);
  rVar4._M_mask = (_Bit_type)in_stack_ffffffffffffff38;
  rVar4._M_p = (_Bit_type *)in_stack_ffffffffffffff40;
  while( true ) {
    bVar2 = ::std::__detail::operator!=(&local_40,&local_48);
    if (!bVar2) break;
    local_50 = ::std::__detail::_Node_const_iterator<duckdb::ColumnBinding,_true,_true>::operator*
                         ((_Node_const_iterator<duckdb::ColumnBinding,_true,_true> *)0xcfa70d);
    local_58 = 0;
    while( true ) {
      uVar1 = local_58;
      sVar3 = ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::size
                        (in_RDI);
      if (sVar3 <= uVar1) break;
      this_00 = local_50;
      rhs = vector<duckdb::ColumnBinding,_true>::operator[]
                      ((vector<duckdb::ColumnBinding,_true> *)rVar4._M_p,rVar4._M_mask);
      bVar2 = ColumnBinding::operator==(this_00,rhs);
      if (bVar2) {
        rVar4 = vector<bool,_true>::operator[]((vector<bool,_true> *)rVar4._M_p,rVar4._M_mask);
        local_68 = rVar4;
        ::std::_Bit_reference::operator=((_Bit_reference *)&local_68,false);
      }
      local_58 = local_58 + 1;
    }
    ::std::__detail::_Node_const_iterator<duckdb::ColumnBinding,_true,_true>::operator++
              ((_Node_const_iterator<duckdb::ColumnBinding,_true,_true> *)rVar4._M_p);
  }
  return;
}

Assistant:

CMChildInfo::CMChildInfo(LogicalOperator &op, const column_binding_set_t &referenced_bindings)
    : bindings_before(op.GetColumnBindings()), types(op.types), can_compress(bindings_before.size(), true) {
	for (const auto &binding : referenced_bindings) {
		for (idx_t binding_idx = 0; binding_idx < bindings_before.size(); binding_idx++) {
			if (binding == bindings_before[binding_idx]) {
				can_compress[binding_idx] = false;
			}
		}
	}
}